

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::Bool(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
       *this,bool b)

{
  bool bVar1;
  SchemaType *this_00;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *context;
  char *pcVar2;
  SizeType i_;
  ulong uVar3;
  
  if (this->valid_ != true) {
    return false;
  }
  bVar1 = BeginValue(this);
  if ((bVar1) || ((this->flags_ & 1) != 0)) {
    this_00 = CurrentSchema(this);
    context = internal::Stack<rapidjson::CrtAllocator>::
              Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                        (&this->schemaStack_);
    bVar1 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::Bool(this_00,context,b);
    if ((bVar1) || ((this->flags_ & 1) != 0)) {
      for (pcVar2 = (this->schemaStack_).stack_; pcVar2 != (this->schemaStack_).stackTop_;
          pcVar2 = pcVar2 + 0x90) {
        if (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar2 + 0x38) !=
            (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x0) {
          internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Bool
                    (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar2 + 0x38),b);
        }
        if (*(long *)(pcVar2 + 0x48) != 0) {
          for (uVar3 = 0; uVar3 < *(uint *)(pcVar2 + 0x50); uVar3 = uVar3 + 1) {
            Bool((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                  *)(*(long *)(*(long *)(pcVar2 + 0x48) + uVar3 * 8) + -8),b);
          }
        }
        if (*(long *)(pcVar2 + 0x58) != 0) {
          for (uVar3 = 0; uVar3 < *(uint *)(pcVar2 + 0x60); uVar3 = uVar3 + 1) {
            Bool((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                  *)(*(long *)(*(long *)(pcVar2 + 0x58) + uVar3 * 8) + -8),b);
          }
        }
      }
      bVar1 = EndValue(this);
      if ((bVar1) || ((this->flags_ & 1) != 0)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      goto LAB_0014c0ce;
    }
  }
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->documentStack_,1);
  *pcVar2 = '\0';
  internal::Stack<rapidjson::CrtAllocator>::Pop<char>(&this->documentStack_,1);
  bVar1 = false;
LAB_0014c0ce:
  this->valid_ = bVar1;
  return bVar1;
}

Assistant:

bool Bool(bool b)       { RAPIDJSON_SCHEMA_HANDLE_VALUE_(Bool,   (CurrentContext(), b), (b)); }